

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O0

Known * __thiscall
Nonogram::get_board_vertical(Known *__return_storage_ptr__,Nonogram *this,uint x,Board *board)

{
  int iVar1;
  const_reference cVar2;
  const_reference pvVar3;
  reference rVar4;
  reference local_b8;
  reference local_a8;
  int local_98;
  allocator<bool> local_91;
  int i;
  vector<bool,_std::allocator<bool>_> value;
  allocator<bool> local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> set;
  Board *board_local;
  uint x_local;
  Nonogram *this_local;
  
  iVar1 = this->m_y;
  set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)board;
  std::allocator<bool>::allocator(&local_51);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_50,(long)iVar1,&local_51);
  std::allocator<bool>::~allocator(&local_51);
  iVar1 = this->m_y;
  std::allocator<bool>::allocator(&local_91);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,(long)iVar1,&local_91);
  std::allocator<bool>::~allocator(&local_91);
  for (local_98 = 0; local_98 < this->m_y; local_98 = local_98 + 1) {
    pvVar3 = std::
             vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           *)set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage,(ulong)x);
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar3,(long)local_98);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_50,(long)local_98);
    local_a8 = rVar4;
    std::_Bit_reference::operator=(&local_a8,cVar2);
    pvVar3 = std::
             vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           *)(set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage + 3),(ulong)x);
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar3,(long)local_98);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)local_98);
    local_b8 = rVar4;
    std::_Bit_reference::operator=(&local_b8,cVar2);
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<bool,_std::allocator<bool>_>_&,_true>
            (__return_storage_ptr__,(vector<bool,_std::allocator<bool>_> *)local_50,
             (vector<bool,_std::allocator<bool>_> *)&i);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_50)
  ;
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_board_vertical(unsigned int x, const Board &board) const {
    vector<bool> set(m_y), value(m_y);

    for (int i = 0; i < m_y; i++) {
        set[i] = board.first[x][i];
        value[i] = board.second[x][i];
    }

    return {set, value};
}